

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

string * dlib::cast_to_string<long>(long *item)

{
  byte bVar1;
  cast_to_string_error *this;
  long *in_RSI;
  string *in_RDI;
  ostringstream sout;
  long local_188 [47];
  long *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  std::ostream::operator<<((ostringstream *)local_188,*local_10);
  bVar1 = std::ios::operator!((ios *)((long)local_188 + *(long *)(local_188[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
    return in_RDI;
  }
  this = (cast_to_string_error *)__cxa_allocate_exception(0x30);
  cast_to_string_error::cast_to_string_error(this);
  __cxa_throw(this,&cast_to_string_error::typeinfo,cast_to_string_error::~cast_to_string_error);
}

Assistant:

const std::string cast_to_string (
        const T& item 
    )
    {
        std::ostringstream sout;
        sout << item;
        if (!sout)
            throw cast_to_string_error();
        return sout.str();
    }